

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

void __thiscall
QSocks5SocketEnginePrivate::parseAuthenticatingReply(QSocks5SocketEnginePrivate *this)

{
  long lVar1;
  QSocks5Authenticator *pQVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool authComplete;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = this->data->authenticator;
  iVar3 = (*pQVar2->_vptr_QSocks5Authenticator[4])(pQVar2,this->data->controlSocket);
  if ((char)iVar3 == '\0') {
    reauthenticate(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::parseAuthenticatingReply()
{
    bool authComplete = false;
    if (!data->authenticator->continueAuthenticate(data->controlSocket, &authComplete)) {
        reauthenticate();
        return;
    }
    if (authComplete)
        sendRequestMethod();
}